

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_repeat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ulong uVar1;
  JSValue val_00;
  int iVar2;
  JSValueUnion p;
  uint uVar3;
  JSValue JVar4;
  StringBuffer b_s;
  int64_t val;
  StringBuffer local_60;
  JSValueUnion local_40;
  ulong local_38;
  
  JVar4 = JS_ToStringCheckObject(ctx,this_val);
  p = JVar4.u;
  if ((uint)JVar4.tag != 6) {
    local_60.ctx = (JSContext *)(argv->u).ptr;
    val_00 = *argv;
    if (0xfffffff4 < (uint)argv->tag) {
      ((local_60.ctx)->header).ref_count = ((local_60.ctx)->header).ref_count + 1;
    }
    iVar2 = JS_ToInt64SatFree(ctx,(int64_t *)&local_38,val_00);
    if (iVar2 == 0) {
      if ((local_38 & 0xffffffff80000000) == 0) {
        if (local_38 == 1) {
          return JVar4;
        }
        uVar1 = *(ulong *)((long)p.ptr + 4);
        uVar3 = (uint)uVar1 & 0x7fffffff;
        if ((uVar1 & 0x7fffffff) == 0) {
          return JVar4;
        }
        if ((long)(((uint)uVar1 & 0x7fffffff) * local_38) < 0x40000000) {
          iVar2 = (int)local_38;
          local_60.size = uVar3 * iVar2;
          local_60.is_wide_char = (uint)(uVar1 >> 0x1f) & 1;
          local_60.len = 0;
          local_60.error_status = 0;
          local_60.ctx = ctx;
          local_60.str = js_alloc_string(ctx,local_60.size,local_60.is_wide_char);
          if (local_60.str != (JSString *)0x0) {
            if (uVar3 == 1) {
              if ((*(byte *)((long)p.ptr + 7) & 0x80) == 0) {
                uVar3 = (uint)(byte)(((JSString *)((long)p.ptr + 0x10))->header).ref_count;
              }
              else {
                uVar3 = (uint)(ushort)(((JSString *)((long)p.ptr + 0x10))->header).ref_count;
              }
              string_buffer_fill(&local_60,uVar3,iVar2);
            }
            else if (local_38 != 0) {
              iVar2 = iVar2 + 1;
              do {
                string_buffer_concat(&local_60,(JSString *)p.ptr,0,uVar3);
                iVar2 = iVar2 + -1;
              } while (1 < iVar2);
            }
            JS_FreeValue(ctx,JVar4);
            JVar4 = string_buffer_end(&local_60);
            return JVar4;
          }
          local_60.size = 0;
          local_60.error_status = -1;
          local_60.str = (JSString *)0x0;
        }
        else {
          JS_ThrowInternalError(ctx,"string too long");
        }
      }
      else {
        JS_ThrowRangeError(ctx,"invalid repeat count");
      }
    }
  }
  if ((0xfffffff4 < (uint)JVar4.tag) && (iVar2 = *p.ptr, *(int *)p.ptr = iVar2 + -1, iVar2 < 2)) {
    local_40 = p;
    __JS_FreeValueRT(ctx->rt,JVar4);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_string_repeat(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int64_t val;
    int n, len;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        goto fail;
    if (JS_ToInt64Sat(ctx, &val, argv[0]))
        goto fail;
    if (val < 0 || val > 2147483647) {
        JS_ThrowRangeError(ctx, "invalid repeat count");
        goto fail;
    }
    n = val;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (len == 0 || n == 1)
        return str;
    if (val * len > JS_STRING_LEN_MAX) {
        JS_ThrowInternalError(ctx, "string too long");
        goto fail;
    }
    if (string_buffer_init2(ctx, b, n * len, p->is_wide_char))
        goto fail;
    if (len == 1) {
        string_buffer_fill(b, string_get(p, 0), n);
    } else {
        while (n-- > 0) {
            string_buffer_concat(b, p, 0, len);
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    return JS_EXCEPTION;
}